

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

MatchProperties __thiscall cmFileCopier::CollectMatchProperties(cmFileCopier *this,string *file)

{
  MatchProperties MVar1;
  bool bVar2;
  bool bVar3;
  reference this_00;
  MatchRule *mr;
  iterator __end1;
  iterator __begin1;
  vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_> *__range1;
  bool matched;
  string *file_to_match;
  string *file_local;
  cmFileCopier *this_local;
  MatchProperties result;
  
  bVar3 = false;
  MatchProperties::MatchProperties((MatchProperties *)&this_local);
  __end1 = std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::begin
                     (&this->MatchRules);
  mr = (MatchRule *)
       std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                 (&this->MatchRules);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
                                     *)&mr), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
              ::operator*(&__end1);
    bVar2 = cmsys::RegularExpression::find(&this_00->Regex,file);
    if (bVar2) {
      bVar3 = true;
      this_local._0_4_ =
           CONCAT31(this_local._1_3_,
                    ((uint)this_local & 1) != 0 || ((this_00->Properties).Exclude & 1U) != 0);
      this_local._4_4_ = (this_00->Properties).Permissions | this_local._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
    ::operator++(&__end1);
  }
  if ((!bVar3) && ((this->MatchlessFiles & 1U) == 0)) {
    bVar3 = cmsys::SystemTools::FileIsDirectory(file);
    this_local._0_4_ = (CONCAT31(this_local._1_3_,bVar3) ^ 0xff) & 0xffffff01;
  }
  MVar1.Permissions = this_local._4_4_;
  MVar1._0_4_ = (uint)this_local;
  return MVar1;
}

Assistant:

cmFileCopier::MatchProperties cmFileCopier::CollectMatchProperties(
  const std::string& file)
{
  // Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
  const std::string file_to_match = cmSystemTools::LowerCase(file);
#else
  const std::string& file_to_match = file;
#endif

  // Collect properties from all matching rules.
  bool matched = false;
  MatchProperties result;
  for (MatchRule& mr : this->MatchRules) {
    if (mr.Regex.find(file_to_match)) {
      matched = true;
      result.Exclude |= mr.Properties.Exclude;
      result.Permissions |= mr.Properties.Permissions;
    }
  }
  if (!matched && !this->MatchlessFiles) {
    result.Exclude = !cmSystemTools::FileIsDirectory(file);
  }
  return result;
}